

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  undefined1 *local_3f8;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [32];
  string local_378 [39];
  allocator<char> local_351;
  string local_350 [39];
  allocator<char> local_329;
  string local_328 [32];
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [32];
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [32];
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [32];
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [55];
  allocator<char> local_79;
  string local_78 [32];
  string local_58 [32];
  undefined1 local_38 [8];
  string shader_source;
  TestShaderType tested_shader_type_local;
  SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  shader_source.field_2._12_4_ = tested_shader_type;
  std::__cxx11::string::string((string *)local_38,(string *)shader_start_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"    float",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"[2]",&local_b1);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_58,this,local_78,local_b0,2);
  std::__cxx11::string::operator+=((string *)local_38,local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8," a",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"[2]",&local_121);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_d8,this,local_f8,local_120,0);
  std::__cxx11::string::operator+=((string *)local_38,local_d8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::operator+=((string *)local_38,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"b",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"[2]",&local_191);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_148,this,local_168,local_190,1);
  std::__cxx11::string::operator+=((string *)local_38,local_148);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::operator+=((string *)local_38,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"c",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"[2]",&local_201);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_1b8,this,local_1d8,local_200,2);
  std::__cxx11::string::operator+=((string *)local_38,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::operator+=((string *)local_38,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_248,"d",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_270,"[2]",&local_271);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_228,this,local_248,local_270,3);
  std::__cxx11::string::operator+=((string *)local_38,local_228);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::operator+=((string *)local_38,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"e",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"[2]",&local_2e1);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_298,this,local_2b8,local_2e0,4);
  std::__cxx11::string::operator+=((string *)local_38,local_298);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::operator+=((string *)local_38,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_328,"f",&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_350,"[2]",&local_351);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_308,this,local_328,local_350,5);
  std::__cxx11::string::operator+=((string *)local_38,local_308);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator(&local_351);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::operator+=((string *)local_38,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"g",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,"[2]",(allocator<char> *)((long)&cs + 7));
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_378,this,local_398,local_3c0,6);
  std::__cxx11::string::operator+=((string *)local_38,local_378);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cs + 7));
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::operator+=((string *)local_38,";\n");
  switch(shader_source.field_2._12_4_) {
  case 0:
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)local_38,"\n\tgl_Position = vec4(0.0);\n");
    break;
  case 2:
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)local_38,(string *)emit_quad_abi_cxx11_);
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)local_38,(string *)set_tesseation_abi_cxx11_);
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x5fe);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=((string *)local_38,(string *)shader_end_abi_cxx11_);
  tcs = (string *)default_vertex_shader_source_abi_cxx11_;
  local_3f8 = default_fragment_shader_source_abi_cxx11_;
  switch(shader_source.field_2._12_4_) {
  case 0:
    local_3f8 = local_38;
    break;
  case 1:
    tcs = (string *)local_38;
    break;
  case 2:
    tcs = (string *)empty_string_abi_cxx11_;
    local_3f8 = empty_string_abi_cxx11_;
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x601);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[9])(this,tcs,local_3f8,1,0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void SizedDeclarationsTypenameStyle2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_source = shader_start;

	shader_source += this->extend_string("    float", "[2]", 2);
	shader_source += this->extend_string(" a", "[2]", 0);
	shader_source += ", ";
	shader_source += this->extend_string("b", "[2]", 1);
	shader_source += ", ";
	shader_source += this->extend_string("c", "[2]", 2);
	shader_source += ", ";
	shader_source += this->extend_string("d", "[2]", 3);
	shader_source += ", ";
	shader_source += this->extend_string("e", "[2]", 4);
	shader_source += ", ";
	shader_source += this->extend_string("f", "[2]", 5);
	shader_source += ", ";
	shader_source += this->extend_string("g", "[2]", 6);
	shader_source += ";\n";

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
}